

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

int decim(char *r,uint64_t v,char chars,char leading)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uVar4;
  ulong local_28;
  uint64_t q;
  int n;
  char leading_local;
  char chars_local;
  uint64_t v_local;
  char *r_local;
  
  q._0_4_ = chars + -1;
  local_28 = 1;
  v_local = (uint64_t)(r + (int)q);
  for (; -1 < (int)q; q._0_4_ = (int)q + -1) {
    if (v / local_28 == 0) {
      uVar4 = 0x20;
      if (leading != '\0') {
        uVar4 = 0x30;
      }
      *(undefined1 *)v_local = uVar4;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_28;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = v;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = SUB168(auVar2 / auVar1,0);
      *(char *)v_local = SUB161(auVar3 % ZEXT816(10),0) + '0';
    }
    v_local = v_local - 1;
    local_28 = local_28 * 10;
  }
  if (v / local_28 != 0) {
    *(undefined1 *)(v_local + 1) = 0x21;
  }
  return (int)chars;
}

Assistant:

static int
decim(char *r, uint64_t v, char chars, char leading)
{
	int n = chars - 1;
	uint64_t q = 1;

	r += n;

	while (n >= 0) {
		if (v / q)
			*r-- = '0' + ((v / q) % 10);
		else
			*r-- = leading ? '0' : ' ';
		q = q * 10;
		n--;
	}

	if (v / q)
		/* the number is bigger than the allowed chars! */
		r[1] = '!';

	return chars;
}